

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::getTexelBlockSize(deUint32 format)

{
  bool bVar1;
  CompressedTexFormat format_00;
  TextureFormat local_18;
  deUint32 local_10;
  int local_c;
  deUint32 format_local;
  
  local_10 = format;
  bVar1 = glu::isCompressedFormat(format);
  if (bVar1) {
    format_00 = glu::mapGLCompressedTexFormat(local_10);
    local_c = tcu::getBlockSize(format_00);
  }
  else {
    local_18 = glu::mapGLInternalFormat(local_10);
    local_c = tcu::TextureFormat::getPixelSize(&local_18);
  }
  return local_c;
}

Assistant:

int getTexelBlockSize (deUint32 format)
{
	if (glu::isCompressedFormat(format))
		return tcu::getBlockSize(glu::mapGLCompressedTexFormat(format));
	else
		return glu::mapGLInternalFormat(format).getPixelSize();
}